

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.hpp
# Opt level: O0

size_t mio::detail::query_file_size(file_handle_type handle,error_code *error)

{
  int iVar1;
  error_code eVar2;
  undefined4 uStack_bc;
  undefined1 local_b0 [8];
  stat sbuf;
  error_code *error_local;
  size_t sStack_10;
  file_handle_type handle_local;
  
  sbuf.__glibc_reserved[2] = (__syscall_slong_t)error;
  std::error_code::clear(error);
  iVar1 = fstat(handle,(stat *)local_b0);
  if (iVar1 == -1) {
    eVar2 = last_error();
    *(ulong *)sbuf.__glibc_reserved[2] = CONCAT44(uStack_bc,eVar2._M_value);
    *(error_category **)(sbuf.__glibc_reserved[2] + 8) = eVar2._M_cat;
    sStack_10 = 0;
  }
  else {
    sStack_10 = sbuf.st_rdev;
  }
  return sStack_10;
}

Assistant:

inline size_t query_file_size(file_handle_type handle, std::error_code& error)
{
    error.clear();
#ifdef _WIN32
    LARGE_INTEGER file_size;
    if(::GetFileSizeEx(handle, &file_size) == 0)
    {
        error = detail::last_error();
        return 0;
    }
	return static_cast<int64_t>(file_size.QuadPart);
#else // POSIX
    struct stat sbuf;
    if(::fstat(handle, &sbuf) == -1)
    {
        error = detail::last_error();
        return 0;
    }
    return sbuf.st_size;
#endif
}